

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall irr::video::CNullDriver::~CNullDriver(CNullDriver *this,void **vtt)

{
  _func_int **pp_Var1;
  IAttributes *pIVar2;
  IFileSystem *pIVar3;
  IMeshManipulator *pIVar4;
  pointer ppIVar5;
  IImageLoader *pIVar6;
  pointer ppIVar7;
  ulong uVar8;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IVideoDriver)._vptr_IVideoDriver = pp_Var1;
  *(void **)((long)&(this->super_IVideoDriver)._vptr_IVideoDriver + (long)pp_Var1[-3]) = vtt[3];
  *(undefined8 *)&(this->super_IVideoDriver).field_0x8 = 0x280360;
  pIVar2 = this->DriverAttributes;
  if (pIVar2 != (IAttributes *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar2->_vptr_IAttributes + (long)pIVar2->_vptr_IAttributes[-3]));
  }
  pIVar3 = this->FileSystem;
  if (pIVar3 != (IFileSystem *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar3->_vptr_IFileSystem + (long)pIVar3->_vptr_IFileSystem[-3]));
  }
  pIVar4 = this->MeshManipulator;
  if (pIVar4 != (IMeshManipulator *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar4->_vptr_IMeshManipulator + (long)pIVar4->_vptr_IMeshManipulator[-3]));
  }
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x24])(this);
  deleteAllTextures(this);
  for (uVar8 = 0;
      ppIVar5 = (this->SurfaceLoader).m_data.
                super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < ((ulong)((long)(this->SurfaceLoader).m_data.
                             super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5) >> 3 &
              0xffffffff); uVar8 = uVar8 + 1) {
    pIVar6 = ppIVar5[uVar8];
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar6->_vptr_IImageLoader +
               (long)pIVar6->_vptr_IImageLoader[0xfffffffffffffffd]));
  }
  for (uVar8 = 0;
      ppIVar7 = (this->SurfaceWriter).m_data.
                super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < ((ulong)((long)(this->SurfaceWriter).m_data.
                             super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar7) >> 3 &
              0xffffffff); uVar8 = uVar8 + 1) {
    IReferenceCounted::drop(&ppIVar7[uVar8]->super_IReferenceCounted);
  }
  deleteMaterialRenders(this);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x19])(this);
  SMaterial::~SMaterial(&this->InitMaterial2D);
  SMaterial::~SMaterial(&this->OverrideMaterial2D);
  SOverrideMaterial::~SOverrideMaterial(&this->OverrideMaterial);
  std::__cxx11::
  _List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ::_M_clear(&(this->HWBufferList).
              super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
            );
  std::
  vector<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ::~vector(&(this->MaterialRenderers).m_data);
  std::_Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>::
  ~_Vector_base((_Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                 *)&this->SurfaceWriter);
  std::_Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>::
  ~_Vector_base((_Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
                 *)&this->SurfaceLoader);
  std::_Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>::~_Vector_base
            ((_Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_> *)
             &this->SharedDepthTextures);
  std::_Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>::
  ~_Vector_base((_Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                 *)&this->RenderTargets);
  std::
  vector<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>::
  ~vector(&(this->OcclusionQueries).m_data);
  std::
  _Vector_base<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
  ::~_Vector_base((_Vector_base<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
                   *)&(this->super_IVideoDriver).field_0x10);
  return;
}

Assistant:

CNullDriver::~CNullDriver()
{
	if (DriverAttributes)
		DriverAttributes->drop();

	if (FileSystem)
		FileSystem->drop();

	if (MeshManipulator)
		MeshManipulator->drop();

	removeAllRenderTargets();

	deleteAllTextures();

	u32 i;
	for (i = 0; i < SurfaceLoader.size(); ++i)
		SurfaceLoader[i]->drop();

	for (i = 0; i < SurfaceWriter.size(); ++i)
		SurfaceWriter[i]->drop();

	// delete material renderers
	deleteMaterialRenders();

	// delete hardware mesh buffers
	removeAllHardwareBuffers();
}